

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O1

void uo_tcp_conn_after_close(uo_cb *cb)

{
  void *pvVar1;
  
  pvVar1 = uo_cb_stack_index(cb,0);
  uo_queue_enqueue(*(uo_queue **)(*(long *)((long)pvVar1 + 0x30) + 0x98),
                   (void *)(long)*(int *)((long)pvVar1 + 0x60),true);
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_after_close(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    uo_tcp_conn_destroy(tcp_conn);
    uo_cb_invoke(cb);
}